

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

bool __thiscall
dg::llvmdg::legacy::GraphBuilder::createPthreadCreate
          (GraphBuilder *this,CallInst *callInst,Block *lastBlock)

{
  bool bVar1;
  size_type sVar2;
  iterator this_00;
  iterator llvmFunction;
  reference ppFVar3;
  GraphBuilder *in_RDI;
  Function *function;
  Function *forkFunction_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range2_1;
  Function *forkFunction;
  iterator __end2;
  iterator __begin2;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range2;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctionsWithBlock;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctions;
  Value *calledValue;
  bool createBlock;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar4;
  Function *in_stack_ffffffffffffff60;
  Function *function_00;
  Value *in_stack_ffffffffffffff80;
  GraphBuilder *in_stack_ffffffffffffff88;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  local_68;
  undefined1 *local_60;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_58;
  undefined1 local_40 [24];
  Value *local_28;
  byte local_19;
  
  local_19 = 0;
  local_28 = llvm::CallBase::getArgOperand
                       ((CallBase *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff4c);
  getCalledFunctions(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x21d5af);
  local_60 = local_40;
  local_68._M_current =
       (Function **)
       std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                 ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator*(&local_68);
    bVar1 = llvm::Function::empty((Function *)0x21d608);
    if (!bVar1) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                 in_stack_ffffffffffffff60,(value_type *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator++(&local_68);
  }
  sVar2 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::size
                    (&local_58);
  local_19 = (local_19 & 1) != 0 || sVar2 != 0;
  this_00 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                      ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  llvmFunction = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
                           ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                             *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
              ::operator*((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                           *)&stack0xffffffffffffff78);
    function_00 = (Function *)*ppFVar3;
    in_stack_ffffffffffffff60 =
         createOrGetFunction(in_RDI,(Function *)
                                    CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    Block::addFork((Block *)this_00._M_current,(Function *)llvmFunction._M_current,function_00);
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator++((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                  *)&stack0xffffffffffffff78);
  }
  bVar4 = local_19;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
             in_stack_ffffffffffffff60);
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
             in_stack_ffffffffffffff60);
  return (bool)(bVar4 & 1);
}

Assistant:

bool GraphBuilder::createPthreadCreate(const llvm::CallInst *callInst,
                                       Block *lastBlock) {
    bool createBlock = false;
    llvm::Value *calledValue = callInst->getArgOperand(2);
    auto forkFunctions = getCalledFunctions(calledValue);
    std::vector<const llvm::Function *> forkFunctionsWithBlock;
    for (const auto *forkFunction : forkFunctions) {
        if (!forkFunction->empty()) {
            forkFunctionsWithBlock.push_back(forkFunction);
        }
    }
    createBlock |= forkFunctionsWithBlock.size();
    for (const auto *forkFunction : forkFunctionsWithBlock) {
        auto *function = createOrGetFunction(forkFunction);
        lastBlock->addFork(forkFunction, function);
    }
    return createBlock;
}